

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

uint prvTidyGetUTF8(ctmbstr str,uint *ch)

{
  int iVar1;
  uint n;
  int bytes;
  uint local_10;
  int local_c;
  
  local_c = 0;
  iVar1 = prvTidyDecodeUTF8BytesToChar(&local_10,(int)*str,str + 1,(TidyInputSource *)0x0,&local_c);
  if (iVar1 != 0) {
    local_10 = 0xfffd;
  }
  *ch = local_10;
  return local_c - 1;
}

Assistant:

uint TY_(GetUTF8)( ctmbstr str, uint *ch )
{
    uint n;
    int bytes;

    int err;
    
    bytes = 0;
    
    /* first byte "str[0]" is passed in separately from the */
    /* rest of the UTF-8 byte sequence starting at "str[1]" */
    err = TY_(DecodeUTF8BytesToChar)( &n, str[0], str+1, NULL, &bytes );
    if (err)
    {
#if 1 && defined(_DEBUG)
        fprintf(stderr, "pprint UTF-8 decoding error for U+%x : ", n);
#endif
        n = 0xFFFD; /* replacement char */
    }

    *ch = n;
    return bytes - 1;
}